

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen-cave.c
# Opt level: O3

chunk * town_gen(player *p,wchar_t min_height,wchar_t min_width,char **p_error)

{
  town *ptVar1;
  level_conflict *plVar2;
  loc to_avoid;
  loc_conflict grid2;
  level_map_conflict *plVar3;
  player *ppVar4;
  _Bool _Var5;
  short sVar6;
  uint32_t uVar7;
  wchar_t wVar8;
  wchar_t wVar9;
  int iVar10;
  int iVar11;
  char *pcVar12;
  chunk_conflict *source;
  chunk *c;
  char *pcVar13;
  wchar_t *pwVar14;
  square *psVar15;
  loc lVar16;
  loc lVar17;
  feature *pfVar18;
  short sVar19;
  ulong uVar20;
  loc_conflict lVar21;
  loc_conflict lVar22;
  wchar_t wVar23;
  loc lVar24;
  ulong uVar25;
  long lVar26;
  uint32_t uVar27;
  int iVar28;
  wchar_t y2;
  uint uVar29;
  loc_conflict lVar30;
  loc lVar31;
  loc_conflict lVar32;
  uint uVar33;
  loc grid;
  loc grid_00;
  loc grid_01;
  loc grid_02;
  loc lVar34;
  loc grid_03;
  ulong uVar35;
  int iVar36;
  int iVar37;
  level_conflict *plVar38;
  level_conflict *plVar39;
  loc lVar40;
  loc_conflict lVar41;
  loc lVar42;
  int iVar43;
  loc lVar44;
  loc lVar45;
  loc_conflict lVar46;
  long lVar47;
  bool bVar48;
  bool bVar49;
  loc_conflict door_1;
  loc_conflict door;
  wchar_t lot_south;
  wchar_t lot_e;
  undefined4 uVar50;
  undefined4 in_stack_fffffffffffffec4;
  int *in_stack_fffffffffffffec8;
  loc local_128;
  loc_conflict local_120;
  level_conflict *local_118;
  loc_conflict local_110;
  loc local_108;
  loc_conflict local_100;
  loc local_f8;
  ulong local_f0;
  level_conflict *local_e8;
  loc_conflict local_e0;
  loc_conflict local_d8;
  wchar_t local_d0;
  wchar_t local_cc;
  loc local_c8;
  loc_conflict local_c0;
  loc_conflict local_b8;
  level_conflict *local_b0;
  loc local_a8;
  wchar_t local_9c;
  wchar_t local_98;
  uint local_94;
  ulong local_90;
  ulong local_88;
  player *local_80;
  long *local_78;
  ulong local_70;
  ulong local_68;
  ulong local_60;
  town *local_58;
  ulong local_50;
  int local_48;
  uint local_44;
  ulong local_40;
  loc local_38;
  
  _Var5 = is_daytime();
  local_44 = (uint)(&z_info->town_monsters_day)[!_Var5];
  local_b0 = world->levels + p->place;
  pcVar12 = level_name(local_b0);
  source = chunk_find_name(pcVar12);
  if (0 < (long)world->num_towns) {
    ptVar1 = world->towns;
    uVar20 = 0;
    do {
      if (*(int *)((long)&ptVar1->index + uVar20) == (int)p->place) {
        c = (chunk *)cave_new((uint)z_info->town_hgt,
                              (uint)(z_info->town_wid >>
                                    (*(int *)((long)&ptVar1->num_stores + uVar20) < 5)));
        wVar23 = FEAT_MORE;
        local_80 = p;
        if (source != (chunk_conflict *)0x0) {
          c->depth = source->depth;
          c->place = (int)p->place;
          _Var5 = chunk_copy((chunk_conflict *)c,p,source,L'\0',L'\0',L'\0',false);
          if (!_Var5) {
            quit_fmt("chunk_copy() level bounds failed!");
          }
          chunk_list_remove(pcVar12);
          cave_free(source);
          sVar6 = p->home;
          sVar19 = p->place;
          if (sVar19 == sVar6) {
            _Var5 = find_home(c,&local_e0);
            if (!_Var5) {
              local_b8.x = wVar23;
              _Var5 = cave_find((chunk_conflict *)c,&local_110,square_isinemptysquare);
              if (!_Var5) {
                __assert_fail("0",
                              "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/gen-cave.c"
                              ,0xaf4,"void build_new_house(struct chunk *)");
              }
              wVar23 = local_110.y + L'\xffffffff';
              uVar27 = 8;
              bVar48 = false;
              do {
                local_e8 = (level_conflict *)(ulong)(uint)wVar23;
                lVar44.x = local_110.x + L'\xfffffffe';
                do {
                  lVar44.x = lVar44.x + L'\x01';
                  grid_03.y = wVar23;
                  grid_03.x = lVar44.x;
                  grid2.y = local_110.y;
                  grid2.x = local_110.x;
                  _Var5 = loc_eq((loc_conflict)grid_03,grid2);
                  if (_Var5) {
                    square_set_feat((chunk_conflict *)c,grid_03,FEAT_PERM);
                  }
                  else {
                    lVar22.x = FEAT_PERM;
                    if ((!bVar48) && (uVar7 = Rand_div(uVar27), lVar22.x = FEAT_PERM, uVar7 == 0)) {
                      lVar22.x = lookup_feat("Home");
                      bVar48 = true;
                    }
                    square_set_feat((chunk_conflict *)c,grid_03,lVar22.x);
                    uVar27 = uVar27 - 1;
                  }
                } while (lVar44.x <= local_110.x);
                wVar23 = (wchar_t)local_e8 + L'\x01';
              } while ((wchar_t)local_e8 <= local_110.y);
              p = local_80;
              wVar23 = local_b8.x;
            }
            sVar6 = p->home;
            sVar19 = p->place;
          }
          if (sVar19 != sVar6) {
            local_b8.x = wVar23;
            _Var5 = find_home(c,&local_110);
            if (_Var5) {
              iVar43 = -3;
              wVar23 = local_110.x;
              do {
                lVar44.x = wVar23;
                grid.y = local_110.y;
                grid.x = lVar44.x;
                _Var5 = square_ispermanent((chunk_conflict *)c,grid);
                iVar43 = iVar43 + 1;
                wVar23 = lVar44.x + L'\xffffffff';
              } while (_Var5);
              plVar38 = (level_conflict *)(ulong)(uint)local_110.y;
              lVar44.x = lVar44.x + L'\x01';
              plVar2 = plVar38;
              do {
                plVar39 = plVar2;
                _Var5 = square_ispermanent((chunk_conflict *)c,
                                           (loc)((long)plVar39 << 0x20 | (ulong)(uint)lVar44.x));
                plVar2 = (level_conflict *)(ulong)((int)plVar39 - 1);
              } while (_Var5);
              do {
                wVar23 = local_110.x;
                grid_00.y = local_110.y;
                grid_00.x = wVar23;
                _Var5 = square_ispermanent((chunk_conflict *)c,grid_00);
                iVar43 = iVar43 + 1;
                local_110.x = wVar23 + L'\x01';
              } while (_Var5);
              do {
                _Var5 = square_ispermanent((chunk_conflict *)c,
                                           (loc)((long)plVar38 << 0x20 |
                                                (ulong)(uint)(wVar23 + L'\xffffffff')));
                iVar36 = (int)plVar38;
                plVar38 = (level_conflict *)(ulong)(iVar36 + 1);
              } while (_Var5);
              iVar36 = iVar36 + -1;
              if ((int)plVar39 < iVar36) {
                do {
                  local_e8 = (level_conflict *)(ulong)((int)plVar39 + 1);
                  if (lVar44.x < wVar23) {
                    uVar35 = (long)local_e8 << 0x20;
                    uVar20 = (ulong)(uint)lVar44.x;
                    iVar28 = iVar43;
                    do {
                      square_set_feat((chunk_conflict *)c,(loc)(uVar20 | uVar35),FEAT_FLOOR);
                      uVar20 = (ulong)((int)uVar20 + 1);
                      iVar28 = iVar28 + -1;
                    } while (iVar28 != 0);
                  }
                  plVar39 = local_e8;
                } while (iVar36 != (int)local_e8);
              }
            }
            wVar23 = local_b8.x;
          }
          plVar3 = world;
          pcVar12 = strstr(world->name,"Wilderness");
          plVar2 = local_b0;
          if (pcVar12 != (char *)0x0) {
            plVar38 = plVar3->levels + local_80->last_place;
            pcVar12 = local_b0->north;
            if (pcVar12 == (char *)0x0) {
LAB_0014a3f7:
              pcVar12 = plVar2->east;
              if (pcVar12 != (char *)0x0) {
                pcVar13 = level_name(plVar38);
                iVar43 = strcmp(pcVar12,pcVar13);
                if (iVar43 == 0) {
                  pwVar14 = &FEAT_MORE_EAST;
                  goto LAB_0014bbbb;
                }
              }
              pcVar12 = plVar2->south;
              if (pcVar12 != (char *)0x0) {
                pcVar13 = level_name(plVar38);
                iVar43 = strcmp(pcVar12,pcVar13);
                if (iVar43 == 0) {
                  pwVar14 = &FEAT_MORE_SOUTH;
                  goto LAB_0014bbbb;
                }
              }
              pcVar12 = plVar2->west;
              if (pcVar12 != (char *)0x0) {
                pcVar13 = level_name(plVar38);
                iVar43 = strcmp(pcVar12,pcVar13);
                if (iVar43 == 0) {
                  pwVar14 = &FEAT_MORE_WEST;
                  goto LAB_0014bbbb;
                }
              }
            }
            else {
              pcVar13 = level_name(plVar38);
              iVar43 = strcmp(pcVar12,pcVar13);
              if (iVar43 != 0) goto LAB_0014a3f7;
              pwVar14 = &FEAT_MORE_NORTH;
LAB_0014bbbb:
              wVar23 = *pwVar14;
            }
            if (wVar23 == FEAT_MORE) {
              if (plVar2->north == (char *)0x0) {
                if (plVar2->east == (char *)0x0) {
                  if (plVar2->south == (char *)0x0) {
                    if (plVar2->west == (char *)0x0) goto LAB_0014bc02;
                    pwVar14 = &FEAT_MORE_WEST;
                  }
                  else {
                    pwVar14 = &FEAT_MORE_SOUTH;
                  }
                }
                else {
                  pwVar14 = &FEAT_MORE_EAST;
                }
              }
              else {
                pwVar14 = &FEAT_MORE_NORTH;
              }
              wVar23 = *pwVar14;
            }
          }
LAB_0014bc02:
          lVar44.x = c->height;
          if (lVar44.x < L'\x01') {
            lVar26 = 0;
            uVar20 = 0;
          }
          else {
            uVar35 = (ulong)(uint)c->width;
            lVar47 = 0;
            lVar26 = 0;
            do {
              uVar20 = 0;
              if (0 < (int)uVar35) {
                do {
                  pfVar18 = square_feat((chunk_conflict *)c,(loc)(lVar47 + uVar20));
                  if (pfVar18->fidx == wVar23) goto LAB_0014bc5a;
                  uVar20 = uVar20 + 1;
                  uVar35 = (ulong)c->width;
                } while ((long)uVar20 < (long)uVar35);
                lVar44.x = c->height;
              }
              lVar26 = lVar26 + 1;
              lVar47 = lVar47 + 0x100000000;
            } while (lVar26 < lVar44.x);
          }
LAB_0014bc5a:
          lVar22 = (loc_conflict)(uVar20 & 0xffffffff | lVar26 << 0x20);
          goto LAB_0014bc72;
        }
        c->depth = (int)p->depth;
        c->place = (int)p->place;
        local_70 = uVar20;
        local_58 = ptVar1;
        uVar27 = Rand_div(3);
        local_68 = (ulong)(uint)c->height;
        local_60 = (ulong)(uint)c->width;
        draw_rectangle(c,L'\0',L'\0',c->height + L'\xffffffff',c->width + L'\xffffffff',FEAT_PERM,
                       L'\0',true);
        local_48 = uVar27 + 5;
        if (local_48 < 1) {
          local_48 = 0;
        }
        local_48 = local_48 + 1;
        local_38.x = L'\x01';
        local_38.y = L'\x01';
        local_9c = L'\0';
        local_98 = L'\0';
        local_40 = (ulong)uVar27;
LAB_0014a52e:
        do {
          wVar23 = c->height;
          if (wVar23 < L'\x03') {
            iVar43 = wVar23 + L'\xffffffff';
          }
          else {
            uVar20 = (ulong)(uint)c->width;
            lVar26 = 1;
            lVar44 = local_38;
            do {
              if (2 < (int)uVar20) {
                lVar47 = 1;
                lVar24 = lVar44;
                do {
                  square_set_feat((chunk_conflict *)c,lVar24,FEAT_GRANITE);
                  lVar47 = lVar47 + 1;
                  uVar20 = (ulong)c->width;
                  lVar24 = (loc)((long)lVar24 + 1);
                } while (lVar47 < (long)(uVar20 - 1));
                wVar23 = c->height;
              }
              lVar26 = lVar26 + 1;
              iVar43 = wVar23 + L'\xffffffff';
              lVar44 = (loc)((long)lVar44 + 0x100000000);
            } while (lVar26 < iVar43);
          }
          iVar36 = strcmp(world->name,"Angband Dungeon");
          if (iVar36 == 0) {
            iVar43 = local_48;
            if (-6 < (int)local_40) {
              do {
                build_streamer(c,FEAT_LAVA,L'\0');
                iVar43 = iVar43 + -1;
              } while (iVar43 != 0);
              wVar23 = c->height;
            }
            uVar50 = 0;
            generate_starburst_room
                      (c,L'\x01',L'\x01',wVar23 + L'\xffffffff',c->width + L'\xffffffff',false,
                       FEAT_FLOOR,false);
          }
          else {
            lVar44.x = c->width;
            uVar50 = 0;
            fill_ellipse(c,iVar43 / 2,(lVar44.x - (lVar44.x + L'\xffffffff' >> 0x1f)) + -1 >> 1,
                         (wVar23 - (wVar23 + L'\xfffffffc' >> 0x1f)) + -4 >> 1,
                         (lVar44.x - (lVar44.x + L'\xfffffffa' >> 0x1f)) + -6 >> 1,FEAT_FLOOR,L'\0',
                         false);
          }
          wVar23 = c->height;
          lVar44.x = c->width;
          uVar20 = (ulong)(uint)lVar44.x;
          if (L'\x02' < wVar23) {
            lVar24.x = L'\x01';
            lVar24.y = L'\x01';
            lVar26 = 1;
            do {
              if (2 < (int)uVar20) {
                lVar47 = 1;
                lVar44 = lVar24;
                do {
                  psVar15 = square((chunk_conflict *)c,lVar44);
                  flag_off(psVar15->info,3,4);
                  _Var5 = square_isperm((chunk_conflict *)c,lVar44);
                  if (((!_Var5) && (_Var5 = square_isfiery((chunk_conflict *)c,lVar44), !_Var5)) &&
                     (_Var5 = square_isfloor((chunk_conflict *)c,lVar44), !_Var5)) {
                    square_set_feat((chunk_conflict *)c,lVar44,FEAT_PERM);
                  }
                  lVar47 = lVar47 + 1;
                  uVar20 = (ulong)c->width;
                  lVar44 = (loc)((long)lVar44 + 1);
                } while (lVar47 < (long)(uVar20 - 1));
                wVar23 = c->height;
              }
              lVar44.x = (wchar_t)uVar20;
              lVar26 = lVar26 + 1;
              lVar24 = (loc)((long)lVar24 + 0x100000000);
            } while (lVar26 < wVar23 + L'\xffffffff');
          }
          wVar23 = lVar44.x + L'\x03';
          if (L'\xffffffff' < lVar44.x) {
            wVar23 = lVar44.x;
          }
          uVar27 = Rand_div(lVar44.x / 2);
          lVar40.x = uVar27 + (wVar23 >> 2);
          lVar40.y = L'\0';
          wVar23 = c->height;
          lVar44.x = wVar23 + L'\x03';
          if (L'\xffffffff' < wVar23) {
            lVar44.x = wVar23;
          }
          uVar27 = Rand_div(wVar23 / 2);
          uVar33 = (lVar44.x >> 2) + uVar27;
          local_90 = (ulong)uVar33;
          iVar43 = (int)((ulong)((long)(int)lVar40.x * -0x2aaaaaab) >> 0x20);
          uVar20 = (ulong)(uint)(iVar43 - (iVar43 >> 0x1f));
          local_50 = (ulong)(uint)((c->width - lVar40.x) / 6);
          uVar29 = (lVar44.x >> 2) + uVar27 + 3;
          if (-1 < (int)uVar33) {
            uVar29 = uVar33;
          }
          local_94 = -((int)uVar29 >> 2);
          iVar36 = c->height - uVar33;
          iVar43 = iVar36 + 3;
          if (-1 < iVar36) {
            iVar43 = iVar36;
          }
          local_b0 = (level_conflict *)CONCAT44(local_b0._4_4_,iVar43 >> 2);
          local_78 = *(long **)((long)&local_58->stores + local_70);
          local_a8 = lVar40;
          if (local_78 == (long *)0x0) {
LAB_0014b254:
            if ((int)local_50 < (int)uVar20) {
              local_c8 = (loc)(local_90 << 0x20);
              local_f8 = (loc)((ulong)local_a8 & 0xffffffff);
            }
            else {
              local_c8 = (loc)(local_90 << 0x20);
              local_f8 = (loc)((ulong)local_a8 & 0xffffffff);
              local_100 = (loc_conflict)((long)local_c8 + (long)local_f8);
              do {
                if (((int)uVar20 != 0) &&
                   (uVar35 = uVar20, uVar29 = local_94, (int)local_94 <= (int)local_b0)) {
                  do {
                    local_88 = uVar35;
                    uVar25 = (ulong)uVar29;
                    iVar43 = (int)uVar20;
                    if ((uVar29 != 0) &&
                       ((uVar27 = Rand_div(100), (int)uVar27 < 0x51 &&
                        (uVar27 = Rand_div(2), uVar27 == 0)))) {
                      lVar22 = loc(iVar43,uVar29);
                      get_lot_bounds(c,local_100,lVar22,(wchar_t)&local_110,
                                     (int)&local_110 + L'\x04',&local_e0.x,&local_e0.y,
                                     (int *)CONCAT44(in_stack_fffffffffffffec4,uVar50),
                                     in_stack_fffffffffffffec8);
                      iVar28 = local_e0.y;
                      iVar36 = local_110.y;
                      local_e8 = (level_conflict *)CONCAT44(local_e8._4_4_,local_e0.x);
                      local_70 = uVar25;
                      if (local_110.x <= local_e0.x) {
                        lVar44.x = local_e0.y + L'\x01';
                        bVar48 = true;
                        wVar23 = local_110.x;
                        do {
                          lVar22.x = iVar36;
                          if (iVar36 <= iVar28) {
                            do {
                              grid_02.y = lVar22.x;
                              grid_02.x = wVar23;
                              psVar15 = square((chunk_conflict *)c,grid_02);
                              _Var5 = feat_is_shop((uint)psVar15->feat);
                              if (_Var5) goto LAB_0014b3b0;
                              lVar22.x = lVar22.x + L'\x01';
                            } while (lVar44.x != lVar22.x);
                          }
                          bVar49 = wVar23 != (wchar_t)local_e8;
                          bVar48 = wVar23 < (wchar_t)local_e8;
                          wVar23 = wVar23 + L'\x01';
                        } while (bVar49);
LAB_0014b3b0:
                        iVar43 = (int)local_88;
                        uVar25 = local_70;
                        uVar20 = local_88;
                        if (bVar48) goto LAB_0014b6ca;
                      }
                      lVar22 = loc(iVar43,(int)local_70);
                      get_lot_bounds(c,local_100,lVar22,(wchar_t)&local_110,(wchar_t)&local_e0,
                                     &local_cc,&local_d0,
                                     (int *)CONCAT44(in_stack_fffffffffffffec4,uVar50),
                                     in_stack_fffffffffffffec8);
                      wVar23 = local_cc;
                      iVar43 = local_e0.x;
                      local_108.x = local_110.x;
                      uVar25 = local_70;
                      uVar20 = local_88;
                      if ((local_110.x < local_cc) &&
                         (local_c0.y = 0, local_c0.x = local_d0, local_e0.x < local_d0)) {
                        iVar36 = rand_range(1,4);
                        iVar28 = rand_range(1,2);
                        iVar10 = rand_range(1,5 - iVar36);
                        iVar11 = rand_range(1,3 - iVar28);
                        iVar37 = local_c0.x;
                        lVar22.x = iVar28 + iVar37 + iVar11 + L'\xfffffffc';
                        lVar44.x = local_108.x;
                        wVar8 = iVar10 + iVar36 + wVar23 + L'\xfffffffa';
                        local_78 = (long *)CONCAT44(local_78._4_4_,iVar10 + local_108.x);
                        local_58 = (town *)CONCAT44(local_58._4_4_,wVar8);
                        fill_rectangle(c,iVar11 + iVar43,iVar10 + local_108.x,lVar22.x,wVar8,
                                       FEAT_GRANITE,L'\0');
                        do {
                          local_e8 = (level_conflict *)
                                     CONCAT71(local_e8._1_7_,
                                              (wchar_t)local_58 < lVar44.x ||
                                              lVar44.x < (wchar_t)local_78);
                          bVar48 = lVar44.x <= local_108.x;
                          local_f0 = CONCAT44(local_f0._4_4_,lVar44.x + L'\xffffffff');
                          local_b8.x = lVar44.x + L'\x01';
                          wVar8 = iVar43;
                          do {
                            if ((lVar22.x < wVar8) ||
                               (wVar8 < iVar11 + iVar43 || (char)local_e8 != '\0')) {
                              uVar27 = Rand_div(3);
                              if (uVar27 == 0) {
                                lVar24 = (loc)loc(lVar44.x,wVar8);
                                _Var5 = square_isfloor((chunk_conflict *)c,lVar24);
                                if (_Var5) {
                                  if (lVar44.x != L'\x02' && bVar48) {
                                    lVar24 = (loc)loc((int)local_f0,wVar8);
                                    _Var5 = square_isperm((chunk_conflict *)c,lVar24);
                                    if (_Var5) goto LAB_0014b694;
                                  }
                                  if ((wVar23 <= lVar44.x) && (lVar44.x != c->width + L'\xfffffffe')
                                     ) {
                                    lVar24 = (loc)loc(local_b8.x,wVar8);
                                    _Var5 = square_isperm((chunk_conflict *)c,lVar24);
                                    if (_Var5) goto LAB_0014b694;
                                  }
                                  if (wVar8 != L'\x02' && wVar8 <= iVar43) {
                                    lVar24 = (loc)loc(lVar44.x,wVar8 + L'\xffffffff');
                                    _Var5 = square_isperm((chunk_conflict *)c,lVar24);
                                    if (_Var5) goto LAB_0014b694;
                                  }
                                  pwVar14 = &FEAT_PASS_RUBBLE;
                                  if ((local_c0.x <= wVar8) &&
                                     (pwVar14 = &FEAT_PASS_RUBBLE,
                                     wVar8 != c->height + L'\xfffffffe')) {
                                    lVar24 = (loc)loc(lVar44.x,wVar8 + L'\x01');
                                    _Var5 = square_isperm((chunk_conflict *)c,lVar24);
                                    pwVar14 = &FEAT_PASS_RUBBLE;
                                    if (_Var5) goto LAB_0014b694;
                                  }
LAB_0014b557:
                                  lVar24 = (loc)loc(lVar44.x,wVar8);
                                  square_set_feat((chunk_conflict *)c,lVar24,*pwVar14);
                                }
                              }
                            }
                            else {
                              uVar27 = Rand_div(4);
                              pwVar14 = &FEAT_RUBBLE;
                              if (uVar27 == 0) goto LAB_0014b557;
                            }
LAB_0014b694:
                            wVar8 = wVar8 + L'\x01';
                          } while (iVar37 + L'\x01' != wVar8);
                          bVar48 = lVar44.x != wVar23;
                          uVar25 = local_70;
                          uVar20 = local_88;
                          lVar44.x = local_b8.x;
                        } while (bVar48);
                      }
                    }
LAB_0014b6ca:
                    uVar35 = local_88;
                    uVar29 = (int)uVar25 + 1;
                  } while ((int)uVar25 != (int)local_b0);
                }
                iVar43 = (int)uVar20;
                uVar20 = (ulong)(iVar43 + 1);
              } while (iVar43 != (int)local_50);
            }
            uVar20 = local_90;
            fill_rectangle(c,(wchar_t)local_68,local_a8.x,local_9c,local_a8.x + L'\x01',FEAT_FLOOR,
                           L'\0');
            fill_rectangle(c,(wchar_t)uVar20,(wchar_t)local_60,(wchar_t)uVar20 + L'\x01',local_98,
                           FEAT_FLOOR,L'\0');
            lVar16 = (loc)loc(0,0);
            lVar17 = (loc)loc(0,0);
            plVar3 = world;
            uVar20 = (ulong)lVar17 >> 0x20;
            pcVar12 = strstr(world->name,"Wilderness");
            if (pcVar12 == (char *)0x0) {
              do {
                wVar23 = c->width;
                uVar27 = Rand_div((((uint)(wVar23 / 6 + (wVar23 >> 0x1f)) >> 1) - (wVar23 >> 0x1f))
                                  * 2 + 1);
                iVar43 = (int)((ulong)((long)c->width * -0x2aaaaaab) >> 0x20);
                lVar44.x = ((iVar43 >> 1) - (iVar43 >> 0x1f)) + wVar23 / 2 + uVar27;
                lVar44.y = L'\0';
                _Var5 = square_isfloor((chunk_conflict *)c,lVar44);
                wVar23 = c->height;
                lVar24 = lVar44;
                if (wVar23 < L'\x02' || _Var5) {
                  uVar29 = 0;
                }
                else {
                  lVar26 = 0;
                  do {
                    lVar47 = lVar26;
                    lVar24 = (loc)((long)lVar24 + 0x100000000);
                    _Var5 = square_isfloor((chunk_conflict *)c,lVar24);
                    wVar23 = c->height;
                    if (_Var5) break;
                    lVar26 = lVar47 + 1;
                  } while (lVar26 < wVar23 / 2);
                  uVar29 = (int)lVar47 + 1;
                }
                uVar35 = (ulong)uVar29;
              } while (wVar23 / 2 <= (int)uVar29);
              square_set_feat((chunk_conflict *)c,lVar24,FEAT_MORE);
            }
            else {
              plVar2 = plVar3->levels;
              sVar6 = local_80->place;
              sVar19 = local_80->last_place;
              local_e8 = plVar2;
              if (plVar2[sVar6].north == (char *)0x0) {
                local_b0 = (level_conflict *)0x0;
              }
              else {
                local_b0 = level_by_name(plVar3,plVar2[sVar6].north);
              }
              if (plVar2[sVar6].east == (char *)0x0) {
                local_118 = (level_conflict *)0x0;
              }
              else {
                local_118 = level_by_name(world,plVar2[sVar6].east);
              }
              if (plVar2[sVar6].south == (char *)0x0) {
                local_128 = (loc)0x0;
              }
              else {
                local_128 = (loc)level_by_name(world,plVar2[sVar6].south);
              }
              if (plVar2[sVar6].west == (char *)0x0) {
                local_120 = (loc_conflict)0x0;
              }
              else {
                local_120 = (loc_conflict)level_by_name(world,plVar2[sVar6].west);
              }
              local_e8 = local_e8 + sVar19;
              if (local_b0 == (level_conflict *)0x0) {
                uVar35 = (ulong)lVar16 >> 0x20;
              }
              else {
                uVar35 = 0;
                lVar44 = local_f8;
                do {
                  lVar44 = (loc)((long)lVar44 + 0x100000000);
                  _Var5 = square_isfloor((chunk_conflict *)c,lVar44);
                  uVar35 = (ulong)((int)uVar35 + 1);
                } while (!_Var5);
                square_set_feat((chunk_conflict *)c,lVar44,FEAT_MORE_NORTH);
                if (local_b0 == local_e8) {
                  lVar17 = local_a8;
                  uVar20 = uVar35;
                }
                lVar17 = (loc)((ulong)lVar17 & 0xffffffff);
                lVar16 = local_a8;
              }
              lVar44 = local_c8;
              if (local_118 != (level_conflict *)0x0) {
                lVar16.y = L'\0';
                lVar16.x = c->width;
                do {
                  lVar16.x = lVar16.x + L'\xffffffff';
                  lVar16.y = L'\0';
                  _Var5 = square_isfloor((chunk_conflict *)c,(loc)((ulong)lVar44 | (ulong)lVar16));
                } while (!_Var5);
                square_set_feat((chunk_conflict *)c,(loc)((ulong)lVar44 | (ulong)lVar16),
                                FEAT_MORE_EAST);
                if (local_118 == local_e8) {
                  uVar20 = local_90;
                }
                uVar20 = uVar20 & 0xffffffff;
                lVar17 = (loc)((ulong)lVar17 & 0xffffffff);
                uVar35 = local_90;
                if (local_118 == local_e8) {
                  lVar17.y = L'\0';
                  lVar17.x = lVar16.x;
                }
              }
              lVar24 = local_f8;
              if (local_128 != (loc)0x0) {
                uVar35 = (ulong)(uint)c->height;
                do {
                  uVar35 = (ulong)((int)uVar35 - 1);
                  lVar44 = (loc)(uVar35 << 0x20 | (ulong)lVar24);
                  _Var5 = square_isfloor((chunk_conflict *)c,lVar44);
                } while (!_Var5);
                square_set_feat((chunk_conflict *)c,lVar44,FEAT_MORE_SOUTH);
                if (local_128 == (loc)local_e8) {
                  lVar17 = local_a8;
                  uVar20 = uVar35;
                }
                lVar17 = (loc)((ulong)lVar17 & 0xffffffff);
                lVar44 = local_c8;
                lVar16 = local_a8;
              }
              local_a8 = lVar16;
              if (local_120 == (loc_conflict)0x0) {
                lVar44.x = local_a8.x;
              }
              else {
                do {
                  lVar44 = (loc)((long)lVar44 + 1);
                  _Var5 = square_isfloor((chunk_conflict *)c,lVar44);
                } while (!_Var5);
                square_set_feat((chunk_conflict *)c,lVar44,FEAT_MORE_WEST);
                if (local_120 == (loc_conflict)local_e8) {
                  uVar20 = local_90;
                }
                uVar20 = uVar20 & 0xffffffff;
                if (local_120 == (loc_conflict)local_e8) {
                  lVar17 = lVar44;
                }
                lVar17 = (loc)((ulong)lVar17 & 0xffffffff);
                uVar35 = local_90;
              }
            }
            if (((lVar17.x == L'\0') || (wVar23 = lVar17.x, (int)uVar20 == 0)) &&
               ((lVar44.x == L'\0' ||
                (uVar20 = uVar35 & 0xffffffff, wVar23 = lVar44.x, (int)uVar35 == 0)))) {
              __assert_fail("grid.x && grid.y",
                            "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/gen-cave.c"
                            ,0x9f9,
                            "struct loc place_town_stairs(struct chunk *, struct player *, struct loc)"
                           );
            }
            iVar36 = (int)uVar20 + -1;
            iVar43 = iVar36;
            lVar44.x = wVar23 + L'\xffffffff';
            do {
              lVar24 = (loc)loc(lVar44.x,iVar43);
              _Var5 = square_isfiery((chunk_conflict *)c,lVar24);
              if (_Var5) {
                lVar24 = (loc)loc(lVar44.x,iVar43);
                square_set_feat((chunk_conflict *)c,lVar24,FEAT_GRANITE);
              }
              bVar48 = iVar43 <= (int)uVar20;
              iVar43 = iVar43 + 1;
            } while ((bVar48) ||
                    (bVar48 = lVar44.x <= wVar23, iVar43 = iVar36, lVar44.x = lVar44.x + L'\x01',
                    bVar48));
            lVar22 = (loc_conflict)(uVar20 << 0x20 | (ulong)(uint)wVar23);
LAB_0014bc72:
            ppVar4 = local_80;
            player_place((chunk_conflict2 *)c,local_80,lVar22);
            _Var5 = is_daytime();
            cave_illuminate(c,_Var5);
            for (uVar29 = local_44; uVar29 != 0; uVar29 = uVar29 - 1) {
              to_avoid.x = (ppVar4->grid).x;
              to_avoid.y = (ppVar4->grid).y;
              pick_and_place_distant_monster(c,to_avoid,L'\x03',true,c->depth);
            }
            return c;
          }
          local_b8.y = uVar33;
          local_b8.x = lVar40.x;
          iVar43 = 0;
          local_88 = uVar20;
          while (iVar43 < 100) {
LAB_0014a85a:
            while( true ) {
              uVar27 = Rand_div(2);
              if (uVar27 == 0) {
                uVar27 = Rand_div(2);
                uVar33 = -(uint)(uVar27 == 0) | 1;
                uVar29 = rand_range(local_94,(int)local_b0);
              }
              else {
                uVar33 = rand_range((int)uVar20,(int)local_50);
                uVar27 = Rand_div(2);
                uVar29 = -(uint)(uVar27 == 0) | 1;
              }
              if ((uVar29 == 0) || (uVar33 == 0)) goto LAB_0014a971;
              local_e8 = (level_conflict *)CONCAT44(local_e8._4_4_,iVar43 + 1);
              local_108 = (loc)((ulong)uVar29 << 0x20);
              local_c0.y = uVar29;
              local_c0.x = uVar33;
              local_f0 = (ulong)uVar33;
              get_lot_bounds(c,local_b8,local_c0,(wchar_t)&local_110,(int)&local_110 + L'\x04',
                             &local_e0.x,&local_e0.y,
                             (int *)CONCAT44(in_stack_fffffffffffffec4,uVar50),
                             in_stack_fffffffffffffec8);
              iVar10 = local_e0.y;
              iVar28 = local_e0.x;
              iVar36 = local_110.y;
              if ((4 < local_e0.x - local_110.x) && (2 < local_e0.y - local_110.y)) break;
LAB_0014a94e:
              bVar48 = 0x62 < iVar43;
              uVar20 = local_88;
              iVar43 = (wchar_t)local_e8;
              if (bVar48) goto LAB_0014a52e;
            }
            if (local_110.x <= local_e0.x) {
              lVar44.x = local_e0.y + L'\x01';
              wVar23 = local_110.x;
              do {
                lVar22.x = iVar36;
                if (iVar36 <= iVar10) {
                  do {
                    grid_01.y = lVar22.x;
                    grid_01.x = wVar23;
                    _Var5 = square_isfloor((chunk_conflict *)c,grid_01);
                    if (!_Var5) goto LAB_0014a94e;
                    lVar22.x = lVar22.x + L'\x01';
                  } while (lVar44.x != lVar22.x);
                }
                bVar48 = wVar23 != iVar28;
                wVar23 = wVar23 + L'\x01';
              } while (bVar48);
            }
            if (0x62 < iVar43) break;
            wVar23 = (int)local_90 + uVar29 * 4;
            uVar35 = local_68 & 0xffffffff;
            if (wVar23 <= (wchar_t)local_68) {
              uVar35 = (ulong)(uint)wVar23;
            }
            if (local_9c <= wVar23) {
              local_9c = wVar23;
            }
            iVar43 = (int)local_f0;
            wVar23 = local_a8.x + iVar43 * 6;
            lVar44.x = (wchar_t)local_60;
            local_60 = local_60 & 0xffffffff;
            if (wVar23 <= lVar44.x) {
              local_60 = (ulong)(uint)wVar23;
            }
            if (local_98 <= wVar23) {
              local_98 = wVar23;
            }
            get_lot_bounds(c,local_b8,local_c0,(wchar_t)&local_110,(wchar_t)&local_e0,&local_cc,
                           &local_d0,(int *)CONCAT44(in_stack_fffffffffffffec4,uVar50),
                           in_stack_fffffffffffffec8);
            uVar20 = local_88;
            lVar44.x = local_cc;
            lVar22.x = local_d0;
            iVar36 = local_e0.x;
            wVar23 = local_110.x;
            local_68 = uVar35;
            if (iVar43 - 2U < 0xfffffffd) {
              if (uVar29 == 0xffffffff) {
                uVar29 = local_e0.x + L'\x01';
                uVar27 = Rand_div(2);
                if ((int)uVar29 < lVar22.x - uVar27) {
                  uVar27 = Rand_div(2);
                  uVar29 = lVar22.x - uVar27;
                }
                local_128.y = L'\0';
                local_128.x = uVar29;
                local_108.x = uVar29 - 2;
                local_108.y = L'\0';
                local_f8 = local_128;
              }
              else {
                uVar29 = local_d0 + L'\xffffffff';
                uVar27 = Rand_div(2);
                if ((int)(uVar27 + iVar36) < (int)uVar29) {
                  uVar27 = Rand_div(2);
                  uVar29 = uVar27 + iVar36;
                }
                local_128.y = L'\0';
                local_128.x = uVar29;
                local_f8.x = uVar29 + 2;
                local_f8.y = L'\0';
                local_108 = local_128;
              }
              lVar44.x = local_cc;
              iVar43 = local_110.x;
              local_c0.y = 0;
              local_c0.x = iVar36;
              local_f0 = (ulong)(uint)lVar22.x;
              lVar45.y = L'\0';
              lVar45.x = local_110.x;
              wVar8 = rand_range(local_110.x + L'\x01',local_cc + L'\xfffffffe');
              wVar23 = wVar8 + L'\xfffffffe';
              if (wVar8 + L'\xfffffffe' < iVar43) {
                wVar23 = iVar43;
              }
              local_c8 = lVar45;
              lVar21.x = rand_range(wVar23,wVar8);
              lVar24 = (loc)loc(lVar21.x + L'\xffffffff',local_128.x);
              _Var5 = square_isfloor((chunk_conflict *)c,lVar24);
              lVar22.x = lVar21.x + L'\x01';
              wVar23 = lVar22.x;
              if (lVar22.x < wVar8) {
                wVar23 = wVar8;
              }
              if (_Var5) {
                lVar22.x = lVar21.x;
              }
              lVar30.y = 0;
              lVar30.x = lVar22.x;
              if (_Var5) {
                wVar23 = wVar8;
              }
              local_120.y = 0;
              local_120.x = wVar23;
              wVar8 = wVar23 + L'\x02';
              if (lVar44.x <= wVar23 + L'\x02') {
                wVar8 = lVar44.x;
              }
              lVar21.x = rand_range(lVar22.x + L'\x02',wVar8);
              if (lVar21.x - lVar22.x < 2) {
                wVar23 = local_c8.x;
                y2 = (wchar_t)local_f0;
              }
              else {
                local_100 = lVar30;
                lVar24 = (loc)loc(lVar21.x + L'\x01',local_128.x);
                _Var5 = square_isfloor((chunk_conflict *)c,lVar24);
                if (!_Var5) {
                  lVar41.x = lVar21.x + L'\xffffffff';
                  lVar41.y = 0;
                  lVar21.x = lVar41.x;
                  if (lVar41.x <= wVar23) {
                    local_120 = lVar41;
                  }
                }
                wVar23 = local_c8.x;
                lVar22.x = local_100.x;
                y2 = (wchar_t)local_f0;
              }
              wVar8 = local_108.x;
              wVar9 = local_f8.x;
            }
            else if (uVar29 - 2 < 0xfffffffd) {
              if (iVar43 == -1) {
                uVar29 = local_110.x + L'\x01';
                uVar27 = Rand_div(2);
                uVar7 = Rand_div(2);
                if ((int)uVar29 < lVar44.x - (uVar7 + uVar27)) {
                  uVar27 = Rand_div(2);
                  uVar7 = Rand_div(2);
                  uVar29 = lVar44.x - (uVar7 + uVar27);
                }
                local_120.y = 0;
                local_120.x = uVar29;
                local_100.x = uVar29 - 2;
                local_100.y = 0;
                local_d8 = local_120;
              }
              else {
                uVar29 = local_cc + L'\xffffffff';
                uVar27 = Rand_div(2);
                uVar7 = Rand_div(2);
                if (uVar7 + uVar27 + wVar23 < (int)uVar29) {
                  uVar27 = Rand_div(2);
                  uVar7 = Rand_div(2);
                  uVar29 = uVar7 + uVar27 + wVar23;
                }
                local_120.y = 0;
                local_120.x = uVar29;
                local_d8.x = uVar29 + 2;
                local_d8.y = 0;
                local_100 = local_120;
              }
              iVar43 = local_e0.x;
              local_c8.y = L'\0';
              local_c8.x = wVar23;
              lVar46.y = 0;
              lVar46.x = local_e0.x;
              local_f0 = (ulong)(uint)local_d0;
              lVar22.x = rand_range(local_e0.x,local_d0 + L'\xffffffff');
              wVar23 = lVar22.x + L'\xfffffffe';
              if (lVar22.x + L'\xfffffffe' < iVar43) {
                wVar23 = iVar43;
              }
              local_c0 = lVar46;
              wVar23 = rand_range(wVar23,lVar22.x);
              lVar24 = (loc)loc(local_120.x,wVar23 + L'\xffffffff');
              _Var5 = square_isfloor((chunk_conflict *)c,lVar24);
              wVar8 = wVar23 + L'\x01';
              lVar21.x = wVar8;
              if (wVar8 < lVar22.x) {
                lVar21.x = lVar22.x;
              }
              if (_Var5) {
                wVar8 = wVar23;
              }
              lVar31.y = L'\0';
              lVar31.x = wVar8;
              if (_Var5) {
                lVar21.x = lVar22.x;
              }
              local_128.y = L'\0';
              local_128.x = lVar21.x;
              wVar23 = wVar8 + L'\x01';
              if (wVar8 + L'\x01' <= lVar21.x) {
                wVar23 = lVar21.x;
              }
              iVar43 = lVar21.x + L'\x02';
              if ((int)local_f0 < lVar21.x + L'\x02') {
                iVar43 = (int)local_f0;
              }
              wVar9 = rand_range(wVar23,iVar43);
              lVar34.y = L'\0';
              lVar34.x = wVar9;
              if (wVar9 - wVar8 < 2) {
                wVar23 = local_c8.x;
                lVar22.x = local_100.x;
                y2 = (wchar_t)local_f0;
                lVar21.x = local_d8.x;
              }
              else {
                local_108 = lVar31;
                lVar24 = (loc)loc(local_120.x,wVar9 + L'\x01');
                _Var5 = square_isfloor((chunk_conflict *)c,lVar24);
                wVar23 = local_c8.x;
                if ((!_Var5) &&
                   (lVar34.x = wVar9 + L'\xffffffff', lVar34.y = L'\0', lVar34.x <= lVar21.x)) {
                  local_128 = lVar34;
                }
                lVar22.x = local_100.x;
                lVar21.x = local_d8.x;
                uVar35 = local_f0;
LAB_0014ae7e:
                wVar9 = lVar34.x;
                y2 = (wchar_t)uVar35;
                wVar8 = local_108.x;
              }
            }
            else {
              if (iVar43 < 0) {
                uVar27 = Rand_div(2);
                wVar8 = ~uVar27 + lVar44.x;
                uVar27 = Rand_div(2);
                lVar22.x = lVar44.x;
                if (uVar27 + wVar8 < lVar44.x) {
                  uVar27 = Rand_div(2);
                  lVar22.x = uVar27 + wVar8;
                }
                wVar23 = local_110.x;
                lVar21.x = wVar8 + L'\xfffffffe';
                if (wVar8 + L'\xfffffffe' < local_110.x) {
                  lVar21.x = local_110.x;
                }
                lVar21.x = rand_range(lVar21.x,lVar22.x + L'\xfffffffe');
              }
              else {
                uVar27 = Rand_div(2);
                wVar8 = wVar23 + uVar27 + L'\x01';
                uVar7 = Rand_div(2);
                lVar21.x = wVar23;
                if (wVar23 < wVar8 - uVar7) {
                  uVar7 = Rand_div(2);
                  lVar21.x = wVar8 - uVar7;
                }
                lVar44.x = local_cc;
                lVar22.x = wVar23 + uVar27 + L'\x03';
                if (local_cc < lVar22.x) {
                  lVar22.x = local_cc;
                }
                lVar22.x = rand_range(lVar21.x + L'\x02',lVar22.x);
              }
              wVar9 = local_d0;
              iVar43 = local_e0.x;
              local_100.y = 0;
              local_100.x = lVar21.x;
              local_120.y = 0;
              local_120.x = wVar8;
              local_d8.y = 0;
              local_d8.x = lVar22.x;
              if ((long)local_108 < 0) {
                uVar35 = (ulong)(uint)local_d0;
                uVar27 = Rand_div(2);
                local_128.x = wVar9 - uVar27;
                local_128.y = L'\0';
                lVar34 = local_128;
                if (lVar21.x == wVar8 || lVar22.x == wVar8) {
                  uVar27 = Rand_div(2);
                  lVar34.x = uVar27 + local_128.x;
                  lVar34.y = L'\0';
                }
                local_c0.y = 0;
                local_c0.x = local_e0.x;
                lVar22.x = local_128.x + L'\xfffffffe';
                if (local_128.x + L'\xfffffffe' < local_e0.x) {
                  lVar22.x = local_e0.x;
                }
                lVar42.y = L'\0';
                lVar42.x = lVar22.x;
                if (lVar34.x - lVar22.x < 2) goto LAB_0014b05b;
                local_f8 = lVar34;
                lVar24 = (loc)loc(wVar8,lVar22.x + L'\xffffffff');
                _Var5 = square_isfloor((chunk_conflict *)c,lVar24);
                local_108 = lVar42;
                if (!_Var5) {
                  local_108.x = lVar22.x + L'\x01';
                  local_108.y = L'\0';
                  if (local_128.x < local_108.x) {
                    local_128.y = L'\0';
                    local_128.x = local_108.x;
                  }
                }
                lVar22.x = local_100.x;
                lVar21.x = local_d8.x;
                lVar34 = local_f8;
              }
              else {
                lVar32.y = 0;
                lVar32.x = local_e0.x;
                uVar27 = Rand_div(2);
                local_128.x = uVar27 + iVar43;
                local_128.y = L'\0';
                lVar42 = local_128;
                local_c0 = lVar32;
                if (lVar21.x == wVar8 || lVar22.x == wVar8) {
                  uVar27 = Rand_div(2);
                  lVar42.x = local_128.x - uVar27;
                  lVar42.y = L'\0';
                }
                uVar35 = (ulong)(uint)local_d0;
                lVar22.x = local_128.x + L'\x02';
                if (local_d0 < local_128.x + L'\x02') {
                  lVar22.x = local_d0;
                }
                lVar34.y = L'\0';
                lVar34.x = lVar22.x;
                if (lVar22.x - lVar42.x < 2) {
LAB_0014b05b:
                  local_108 = lVar42;
                  lVar22.x = local_100.x;
                  lVar21.x = local_d8.x;
                }
                else {
                  local_108 = lVar42;
                  lVar24 = (loc)loc(wVar8,lVar22.x + L'\x01');
                  _Var5 = square_isfloor((chunk_conflict *)c,lVar24);
                  if (!_Var5) {
                    lVar34.x = lVar22.x + L'\xffffffff';
                    lVar34.y = L'\0';
                    if (lVar34.x < local_128.x) {
                      local_128.y = L'\0';
                      local_128.x = lVar34.x;
                    }
                  }
                  lVar22.x = local_100.x;
                  lVar21.x = local_d8.x;
                }
              }
              if (((int)local_f0 < 0) && (1 < lVar21.x - lVar22.x)) {
                local_f8 = lVar34;
                local_f0 = uVar35;
                lVar24 = (loc)loc(lVar22.x + L'\xffffffff',local_128.x);
                _Var5 = square_isfloor((chunk_conflict *)c,lVar24);
                uVar35 = local_f0;
                if (!_Var5) {
                  lVar22.x = lVar22.x + L'\x01';
                  lVar22.y = 0;
                  if (wVar8 <= lVar22.x) {
                    local_120 = lVar22;
                  }
                }
LAB_0014b0e9:
                lVar21.x = local_d8.x;
              }
              else {
                if (((int)local_f0 < 1) || (lVar21.x - lVar22.x < 2)) goto LAB_0014ae7e;
                local_f8 = lVar34;
                lVar24 = (loc)loc(lVar21.x + L'\x01',local_128.x);
                _Var5 = square_isfloor((chunk_conflict *)c,lVar24);
                lVar22.x = local_100.x;
                if (_Var5) goto LAB_0014b0e9;
                lVar21.x = local_d8.x + L'\xffffffff';
                lVar21.y = 0;
                if (lVar21.x <= wVar8) {
                  local_120 = lVar21;
                }
              }
              y2 = (wchar_t)uVar35;
              wVar8 = local_108.x;
              wVar9 = local_f8.x;
            }
            if (wVar23 < lVar22.x) {
              wVar23 = lVar22.x;
            }
            if (lVar21.x < lVar44.x) {
              lVar44.x = lVar21.x;
            }
            lVar22.x = local_c0.x;
            if (local_c0.x < wVar8) {
              lVar22.x = wVar8;
            }
            if (wVar9 < y2) {
              y2 = wVar9;
            }
            fill_rectangle(c,lVar22.x,wVar23,y2,lVar44.x,FEAT_PERM,L'\0');
            if (z_info->f_max != 0) {
              lVar26 = 0x29;
              uVar35 = 0;
              do {
                _Var5 = feat_is_shop((wchar_t)uVar35);
                if ((_Var5) && ((int)local_78[3] + 1U == (uint)f_info->flags[lVar26 + -0x2b])) {
                  square_set_feat((chunk_conflict *)c,
                                  (loc)((ulong)local_120 | (long)local_128 << 0x20),(wchar_t)uVar35)
                  ;
                }
                uVar35 = uVar35 + 1;
                lVar26 = lVar26 + 0x78;
              } while (uVar35 < z_info->f_max);
            }
            local_78 = (long *)*local_78;
            iVar43 = (wchar_t)local_e8;
            if (local_78 == (long *)0x0) {
              local_78 = (long *)0x0;
              goto LAB_0014b254;
            }
          }
        } while( true );
      }
      uVar20 = uVar20 + 0x28;
    } while ((long)world->num_towns * 0x28 != uVar20);
  }
  __assert_fail("i < world->num_towns",
                "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/gen-cave.c"
                ,0xb25,"struct chunk *town_gen(struct player *, int, int, const char **)");
LAB_0014a971:
  bVar48 = iVar43 == 99;
  iVar43 = iVar43 + 1;
  if (bVar48) goto LAB_0014a52e;
  goto LAB_0014a85a;
}

Assistant:

struct chunk *town_gen(struct player *p, int min_height, int min_width,
		const char **p_error)
{
	int i;
	struct loc grid;
	int residents = is_daytime() ? z_info->town_monsters_day :
		z_info->town_monsters_night;
	struct level *lev = &world->levels[p->place];
	char *name = level_name(lev);
	struct chunk *c_new, *c_old = chunk_find_name(name);
	struct town *town = NULL;

	/* Find the town */
	for (i = 0; i < world->num_towns; i++) {
		town = &world->towns[i];
		if (town->index == p->place) break;
	}
	assert (i < world->num_towns);

	/* Make a new chunk */
	c_new = cave_new(z_info->town_hgt, town->num_stores > 4 ?
					 z_info->town_wid : z_info->town_wid / 2);

	/* First time */
	if (!c_old) {
		c_new->depth = p->depth;
		c_new->place = p->place;

		/* Build stuff */
		town_gen_layout(c_new, p, town);
	} else {
		int feat = FEAT_MORE;

		/* Copy from the chunk list, remove the old one */
		c_new->depth = c_old->depth;
		c_new->place = p->place;
		if (!chunk_copy(c_new, p, c_old, 0, 0, 0, 0))
			quit_fmt("chunk_copy() level bounds failed!");
		chunk_list_remove(name);
		cave_free(c_old);

		/* Build a new house if needed */
		if (p->place == p->home) {
			struct loc door;
			if (!find_home(c_new, &door)) {
				build_new_house(c_new);
			}
		}

		/* Demolish an old house if needed */
		if (p->place != p->home) {
			struct loc door;
			if (find_home(c_new, &door)) {
				demolish_house(c_new, door);
			}
		}

		/* Get the correct path for wilderness */
		if (strstr(world->name, "Wilderness")) {
			struct level *last_lev = &world->levels[p->last_place];
			if (lev->north && streq(lev->north, level_name(last_lev))) {
				feat = FEAT_MORE_NORTH;
			} else if (lev->east && streq(lev->east, level_name(last_lev))) {
				feat = FEAT_MORE_EAST;
			} else if (lev->south && streq(lev->south, level_name(last_lev))) {
				feat = FEAT_MORE_SOUTH;
			} else if (lev->west && streq(lev->west, level_name(last_lev))) {
				feat = FEAT_MORE_WEST;
			}

			/* Deal with recall */
			if (feat == FEAT_MORE) {
				if (lev->north) {
				feat = FEAT_MORE_NORTH;
				} else if (lev->east) {
					feat = FEAT_MORE_EAST;
				} else if (lev->south) {
					feat = FEAT_MORE_SOUTH;
				} else if (lev->west) {
					feat = FEAT_MORE_WEST;
				}
			}
		}

		/* Find the required stair/path */
		for (grid.y = 0; grid.y < c_new->height; grid.y++) {
			bool found = false;
			for (grid.x = 0; grid.x < c_new->width; grid.x++) {
				if (square_feat(c_new, grid)->fidx == feat) {
					found = true;
					break;
				}
			}
			if (found) break;
		}

		/* Place the player */
		player_place(c_new, p, grid);
	}

	/* Apply illumination */
	cave_illuminate(c_new, is_daytime());

	/* Make some residents */
	for (i = 0; i < residents; i++) {
		pick_and_place_distant_monster(c_new, p->grid, 3, true,
			c_new->depth);
	}

	return c_new;
}